

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxWhileLoop::Emit(FxWhileLoop *this,VMFunctionBuilder *build)

{
  BYTE BVar1;
  PString *pPVar2;
  int iVar3;
  size_t target;
  size_t sVar4;
  ExpEmit EVar5;
  FScriptPosition *other;
  bool bVar6;
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  FString local_50;
  TArray<unsigned_long,_unsigned_long> local_48;
  TArray<unsigned_long,_unsigned_long> local_38;
  
  if (this->Condition->ValueType != (PType *)TypeBool) {
    __assert_fail("Condition->ValueType == TypeBool",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x237c,"virtual ExpEmit FxWhileLoop::Emit(VMFunctionBuilder *)");
  }
  local_38.Array = (unsigned_long *)0x0;
  local_38.Most = 0;
  local_38.Count = 0;
  local_48.Array = (unsigned_long *)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  target = VMFunctionBuilder::GetAddress(build);
  iVar3 = (*this->Condition->_vptr_FxExpression[3])();
  if ((char)iVar3 == '\0') {
    (*this->Condition->_vptr_FxExpression[10])(this->Condition,build,0,&local_38,&local_48);
  }
  else {
    pPVar2 = (PString *)this->Condition[1]._vptr_FxExpression;
    other = &this->Condition[1].ScriptPosition;
    if (pPVar2 == TypeString) {
      FString::AttachToOther(&local_50,&other->FileName);
    }
    else {
      local_50.Chars = (other->FileName).Chars;
    }
    BVar1 = (pPVar2->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      bVar6 = (double)local_50.Chars != 0.0;
    }
    else {
      if (BVar1 != '\0') goto LAB_0053a9d7;
      bVar6 = (int)local_50.Chars != 0;
    }
    if (!bVar6) {
LAB_0053a9d7:
      __assert_fail("static_cast<FxConstant *>(Condition)->GetValue().GetBool() == true",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2387,"virtual ExpEmit FxWhileLoop::Emit(VMFunctionBuilder *)");
    }
    if (pPVar2 == TypeString) {
      FString::~FString(&local_50);
    }
  }
  VMFunctionBuilder::BackpatchListToHere(build,&local_38);
  if (this->Code != (FxExpression *)0x0) {
    FxExpression::EmitStatement(this->Code,build);
  }
  sVar4 = VMFunctionBuilder::Emit(build,0x44,0);
  VMFunctionBuilder::Backpatch(build,sVar4,target);
  VMFunctionBuilder::BackpatchListToHere(build,&local_48);
  sVar4 = VMFunctionBuilder::GetAddress(build);
  FxLoopStatement::Backpatch(&this->super_FxLoopStatement,build,target,sVar4);
  TArray<unsigned_long,_unsigned_long>::~TArray(&local_48);
  TArray<unsigned_long,_unsigned_long>::~TArray(&local_38);
  EVar5.RegNum = 0;
  EVar5.RegType = 0x80;
  EVar5.RegCount = '\x01';
  EVar5.Konst = false;
  EVar5.Fixed = false;
  EVar5.Final = false;
  EVar5.Target = false;
  return EVar5;
}

Assistant:

ExpEmit FxWhileLoop::Emit(VMFunctionBuilder *build)
{
	assert(Condition->ValueType == TypeBool);

	size_t loopstart, loopend;
	TArray<size_t> yes, no;

	// Evaluate the condition and execute/break out of the loop.
	loopstart = build->GetAddress();
	if (!Condition->isConstant())
	{
		Condition->EmitCompare(build, false, yes, no);
	}
	else assert(static_cast<FxConstant *>(Condition)->GetValue().GetBool() == true);

	build->BackpatchListToHere(yes);
	// Execute the loop's content.
	if (Code != nullptr)
	{
		Code->EmitStatement(build);
	}

	// Loop back.
	build->Backpatch(build->Emit(OP_JMP, 0), loopstart);
	build->BackpatchListToHere(no);
	loopend = build->GetAddress();
	Backpatch(build, loopstart, loopend);
	return ExpEmit();
}